

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utImporter.cpp
# Opt level: O0

void __thiscall TestPlugin::~TestPlugin(TestPlugin *this)

{
  TestPlugin *this_local;
  
  ~TestPlugin(this);
  operator_delete(this,0x78);
  return;
}

Assistant:

virtual bool CanRead(
        const std::string& pFile, IOSystem* /*pIOHandler*/, bool /*test*/) const
    {
        std::string::size_type pos = pFile.find_last_of('.');
        // no file extension - can't read
        if( pos == std::string::npos)
            return false;
        std::string extension = pFile.substr( pos);

        // todo ... make case-insensitive
        return (extension == ".apple" || extension == ".mac" ||
            extension == ".linux" || extension == ".windows" );

    }